

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StopThreadIM483Ix(IM483I *pIM483I)

{
  int local_1c;
  int id;
  IM483I *pIM483I_local;
  
  local_1c = 0;
  do {
    if ((IM483I *)addrsIM483I[local_1c] == pIM483I) {
      bExitIM483I[local_1c] = 1;
      WaitForThread(IM483IThreadId[local_1c]);
      DeleteCriticalSection(IM483ICS + local_1c);
      resIM483I[local_1c] = 1;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadIM483Ix(IM483I* pIM483I)
{
	int id = 0;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitIM483I[id] = TRUE;
	WaitForThread(IM483IThreadId[id]);
	DeleteCriticalSection(&IM483ICS[id]);
	resIM483I[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}